

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  pointer pptVar1;
  pointer pptVar2;
  undefined8 uVar3;
  bool bVar4;
  instance *op;
  PyTypeObject *type_00;
  iterator __begin2;
  string local_80;
  iterator local_60;
  values_and_holders local_30;
  
  op = (instance *)(*__stringstream)();
  if (op == (instance *)0x0) {
LAB_0010d9b6:
    op = (instance *)0x0;
  }
  else {
    local_30.inst = op;
    local_30.tinfo = pybind11::detail::all_type_info((op->ob_base).ob_type);
    pybind11::detail::values_and_holders::begin(&local_60,&local_30);
    pptVar1 = ((local_30.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pptVar2 = ((local_30.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (local_60.curr.index != (long)pptVar1 - (long)pptVar2 >> 3) {
      bVar4 = pybind11::detail::value_and_holder::holder_constructed(&local_60.curr);
      uVar3 = _PyExc_TypeError;
      if (!bVar4) {
        pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
                  (&local_80,(detail *)(local_60.curr.type)->type,type_00);
        PyErr_Format(uVar3,"%.200s.__init__() must be called when overriding __init__",
                     local_80._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_80);
        _Py_DECREF((PyObject *)op);
        goto LAB_0010d9b6;
      }
      pybind11::detail::values_and_holders::iterator::operator++(&local_60);
    }
  }
  return &op->ob_base;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // This must be a pybind11 instance
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Ensure that the base __init__ function(s) were called
    for (const auto &vh : values_and_holders(instance)) {
        if (!vh.holder_constructed()) {
            PyErr_Format(PyExc_TypeError, "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}